

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

AActor * SpawnMapThing(int index,FMapThing *mt,int position)

{
  double dVar1;
  double dVar2;
  double dVar3;
  short sVar4;
  uint uVar5;
  bool bVar6;
  AActor *this;
  MetaClass *pMVar7;
  char *local_58;
  AActor *spawned;
  int position_local;
  FMapThing *mt_local;
  int index_local;
  
  this = P_SpawnMapThing(mt,position);
  bVar6 = FBoolCVar::operator_cast_to_bool(&dumpspawnedthings);
  if (bVar6) {
    dVar1 = (mt->pos).X;
    dVar2 = (mt->pos).Y;
    dVar3 = (mt->pos).Z;
    sVar4 = mt->EdNum;
    uVar5 = mt->flags;
    if (this == (AActor *)0x0) {
      local_58 = "(none)";
    }
    else {
      pMVar7 = AActor::GetClass(this);
      local_58 = FName::GetChars(&(pMVar7->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.TypeName);
    }
    Printf("%5d: (%5f, %5f, %5f), doomednum = %5d, flags = %04x, type = %s\n",dVar1,dVar2,dVar3,
           (ulong)(uint)index,(ulong)(uint)(int)sVar4,(ulong)uVar5,local_58);
  }
  T_AddSpawnedThing(this);
  return this;
}

Assistant:

AActor *SpawnMapThing(int index, FMapThing *mt, int position)
{
	AActor *spawned = P_SpawnMapThing(mt, position);
	if (dumpspawnedthings)
	{
		Printf("%5d: (%5f, %5f, %5f), doomednum = %5d, flags = %04x, type = %s\n",
			index, mt->pos.X, mt->pos.Y, mt->pos.Z, mt->EdNum, mt->flags, 
			spawned? spawned->GetClass()->TypeName.GetChars() : "(none)");
	}
	T_AddSpawnedThing(spawned);
	return spawned;
}